

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void pinger_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  pinger_t *pinger_00;
  pinger_t *pinger;
  ssize_t i;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *stream_local;
  
  pinger_00 = (pinger_t *)stream->data;
  if (nread < 0) {
    if (nread != -0xfff) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
              ,0x76,"nread == UV_EOF");
      abort();
    }
    puts("got EOF");
    free(buf->base);
    uv_close(&pinger_00->stream,pinger_on_close);
  }
  else {
    for (pinger = (pinger_t *)0x0; (long)pinger < nread;
        pinger = (pinger_t *)((long)&pinger->vectored_writes + 1)) {
      if (*(char *)((long)&pinger->vectored_writes + (long)buf->base) != PING[pinger_00->state]) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
                ,0x82,"buf->base[i] == PING[pinger->state]");
        abort();
      }
      pinger_00->state = (int)((ulong)(long)(pinger_00->state + 1) % 5);
      if (pinger_00->state == 0) {
        printf("PONG %d\n",(ulong)(uint)pinger_00->pongs);
        pinger_00->pongs = pinger_00->pongs + 1;
        if (999 < pinger_00->pongs) {
          uv_close(&pinger_00->stream,pinger_on_close);
          break;
        }
        pinger_write_ping(pinger_00);
      }
    }
    free(buf->base);
  }
  return;
}

Assistant:

static void pinger_read_cb(uv_stream_t* stream,
                           ssize_t nread,
                           const uv_buf_t* buf) {
  ssize_t i;
  pinger_t* pinger;

  pinger = (pinger_t*)stream->data;

  if (nread < 0) {
    ASSERT(nread == UV_EOF);

    puts("got EOF");
    free(buf->base);

    uv_close((uv_handle_t*)(&pinger->stream.tcp), pinger_on_close);

    return;
  }

  /* Now we count the pings */
  for (i = 0; i < nread; i++) {
    ASSERT(buf->base[i] == PING[pinger->state]);
    pinger->state = (pinger->state + 1) % (sizeof(PING) - 1);

    if (pinger->state != 0)
      continue;

    printf("PONG %d\n", pinger->pongs);
    pinger->pongs++;

    if (pinger->pongs < NUM_PINGS) {
      pinger_write_ping(pinger);
    } else {
      uv_close((uv_handle_t*)(&pinger->stream.tcp), pinger_on_close);
      break;
    }
  }

  free(buf->base);
}